

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

void __thiscall QAction::setData(QAction *this,QVariant *data)

{
  QVariant *this_00;
  QActionPrivate *this_01;
  char cVar1;
  
  this_01 = *(QActionPrivate **)&this->field_0x8;
  this_00 = &this_01->userData;
  cVar1 = ::QVariant::equals(this_00);
  if (cVar1 != '\0') {
    return;
  }
  ::QVariant::operator=(this_00,data);
  QActionPrivate::sendDataChanged(this_01);
  return;
}

Assistant:

void QAction::setData(const QVariant &data)
{
    Q_D(QAction);
    if (d->userData == data)
        return;
    d->userData = data;
    d->sendDataChanged();
}